

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O1

int idaNlsInitSensSim(IDAMem IDA_mem)

{
  int iVar1;
  code *pcVar2;
  char *msgfmt;
  
  if (IDA_mem->ida_lsetup ==
      (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
    pcVar2 = (code *)0x0;
  }
  else {
    pcVar2 = idaNlsLSetupSensSim;
  }
  iVar1 = SUNNonlinSolSetLSetupFn(IDA_mem->NLSsim,pcVar2);
  if (iVar1 == 0) {
    if (IDA_mem->ida_lsolve ==
        (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = idaNlsLSolveSensSim;
    }
    iVar1 = SUNNonlinSolSetLSolveFn(IDA_mem->NLSsim,pcVar2);
    if (iVar1 == 0) {
      iVar1 = SUNNonlinSolInitialize(IDA_mem->NLSsim);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "The nonlinear solver\'s init routine failed.";
      iVar1 = 0x110;
    }
    else {
      msgfmt = "Setting linear solver solve function failed";
      iVar1 = 0x106;
    }
  }
  else {
    msgfmt = "Setting the linear solver setup function failed";
    iVar1 = 0xf8;
  }
  IDAProcessError(IDA_mem,-0x16,iVar1,"idaNlsInitSensSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                  ,msgfmt);
  return -0xf;
}

Assistant:

int idaNlsInitSensSim(IDAMem IDA_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (IDA_mem->ida_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLSsim, idaNlsLSetupSensSim);
  }
  else { retval = SUNNonlinSolSetLSetupFn(IDA_mem->NLSsim, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting the linear solver setup function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (IDA_mem->ida_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLSsim, idaNlsLSolveSensSim);
  }
  else { retval = SUNNonlinSolSetLSolveFn(IDA_mem->NLSsim, NULL); }

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting linear solver solve function failed");
    return (IDA_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(IDA_mem->NLSsim);

  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (IDA_NLS_INIT_FAIL);
  }

  return (IDA_SUCCESS);
}